

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int anycb(int f)

{
  char local_438 [8];
  char pbuf [1035];
  int local_24;
  int ret;
  int save2;
  int save;
  int s;
  buffer *bp;
  int f_local;
  
  save2 = 0;
  ret = 0;
  local_24 = 0;
  _save = bheadp;
  do {
    if (_save == (buffer *)0x0) {
      if (ret == 0) {
        ewprintf("(No files need saving)");
      }
      return save2;
    }
    if ((_save->b_fname[0] != '\0') && ((_save->b_flag & 1U) != 0)) {
      register0x00000000 = snprintf(local_438,0x40b,"Save file %s",_save->b_fname);
      if (((int)register0x00000000 < 0) || (0x40a < register0x00000000)) {
        dobeep_msg("Error: filename too long!");
        return 3;
      }
      if (((f == 1) || (ret = eyorn(local_438), ret == 1)) &&
         (local_24 = buffsave(_save), local_24 == 1)) {
        _save->b_flag = _save->b_flag & 0xfe;
        upmodes(_save);
      }
      else {
        if (local_24 == 3) {
          return 3;
        }
        save2 = 1;
      }
      if (ret == 2) {
        return 2;
      }
      ret = 1;
    }
    _save = (_save->b_list).l_p.x_bp;
  } while( true );
}

Assistant:

int
anycb(int f)
{
	struct buffer	*bp;
	int		 s = FALSE, save = FALSE, save2 = FALSE, ret;
	char		 pbuf[NFILEN + 11];

	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		if (*(bp->b_fname) != '\0' && (bp->b_flag & BFCHG) != 0) {
			ret = snprintf(pbuf, sizeof(pbuf), "Save file %s",
			    bp->b_fname);
			if (ret < 0 || ret >= sizeof(pbuf)) {
				(void)dobeep_msg("Error: filename too long!");
				return (UERROR);
			}
			if ((f == TRUE || (save = eyorn(pbuf)) == TRUE) &&
			    (save2 = buffsave(bp)) == TRUE) {
				bp->b_flag &= ~BFCHG;
				upmodes(bp);
			} else {
				if (save2 == FIOERR)
					return (save2);
				s = TRUE;
			}
			if (save == ABORT)
				return (save);
			save = TRUE;
		}
	}
	if (save == FALSE /* && kbdmop == NULL */ )	/* experimental */
		ewprintf("(No files need saving)");
	return (s);
}